

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>
::load(list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>
       *this,handle src,bool convert)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  reference it;
  value_conv conv;
  handle local_b8;
  handle local_b0;
  vector<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>>
  *local_a8;
  PyObject *local_a0;
  PyObject *local_90;
  long local_88;
  object local_80;
  pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double> local_78;
  tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double> local_58;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_b8.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_00233847;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_b8.m_ptr = src.m_ptr;
    }
    ppVar1 = (this->value).
             super__Vector_base<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->value).
        super__Vector_base<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
      (this->value).
      super__Vector_base<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
    }
    if (local_b8.m_ptr != (PyObject *)0x0) {
      (local_b8.m_ptr)->ob_refcnt = (local_b8.m_ptr)->ob_refcnt + 1;
    }
    local_b0.m_ptr = local_b8.m_ptr;
    reserve_maybe<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_0>
              (this,(sequence *)&local_b0,&this->value);
    pybind11::object::~object((object *)&local_b0);
    local_a0 = local_b8.m_ptr;
    sVar5 = sequence::end((sequence *)&local_b8);
    local_a8 = (vector<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>>
                *)this;
    for (lVar4 = 0; bVar2 = sVar5.super_sequence_slow_readwrite.index == lVar4, !bVar2;
        lVar4 = lVar4 + 1) {
      local_90 = local_a0;
      local_80.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_58.subcasters.first.value.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[2] = 0.0;
      local_58.subcasters.second.value = 0.0;
      local_58.subcasters.first.value.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[0] = 0.0;
      local_58.subcasters.first.value.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[1] = 0.0;
      local_88 = lVar4;
      accessor::operator_cast_to_object((accessor *)&local_78);
      bVar3 = tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>::load
                        (&local_58,
                         (handle)local_78.first.
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                 m_storage.m_data.array[0],convert);
      pybind11::object::~object((object *)&local_78);
      if (!bVar3) {
        pybind11::object::~object(&local_80);
        break;
      }
      local_78.first.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[2] = local_58.subcasters.first.value.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [2];
      local_78.first.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[0] = local_58.subcasters.first.value.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [0];
      local_78.first.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[1] = local_58.subcasters.first.value.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [1];
      local_78.second = local_58.subcasters.second.value;
      std::
      vector<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>>
      ::emplace_back<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>(local_a8,&local_78);
      pybind11::object::~object(&local_80);
    }
    pybind11::object::~object((object *)&local_b8);
  }
  else {
LAB_00233847:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }